

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  pointer *ppcVar1;
  undefined8 *puVar2;
  pointer pcVar3;
  double *pdVar4;
  point_type *ppVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  size_t __i;
  long lVar9;
  result_type rVar10;
  undefined8 *puVar11;
  ostream *poVar12;
  undefined8 uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  unsigned_long uVar17;
  boundary_t *extraout_RDX;
  boundary_t *extraout_RDX_00;
  boundary_t *extraout_RDX_01;
  boundary_t *extraout_RDX_02;
  boundary_t *extraout_RDX_03;
  boundary_t *extraout_RDX_04;
  boundary_t *extraout_RDX_05;
  boundary_t *extraout_RDX_06;
  boundary_t *extraout_RDX_07;
  boundary_t *extraout_RDX_08;
  boundary_t *extraout_RDX_09;
  boundary_t *extraout_RDX_10;
  boundary_t *pbVar18;
  unsigned_long uVar19;
  vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
  *__range1;
  char cVar20;
  char cVar21;
  pointer pcVar22;
  __normal_iterator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_*,_std::vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>_>
  __i_1;
  long lVar23;
  pointer *ppcVar24;
  pointer *ppcVar25;
  vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
  vals;
  string fname;
  string __str;
  string __str_1;
  aabb_t q;
  vector<perior::rectangle<perior::point<double,_2UL>_>,_std::allocator<perior::rectangle<perior::point<double,_2UL>_>_>_>
  boxes;
  point_t u;
  point_t l;
  uniform_int_distribution<unsigned_long> uni;
  rtree_t tree;
  boundary_t bdry;
  mt19937 mt_;
  pointer *local_1648 [2];
  pointer local_1638;
  undefined4 uStack_1630;
  undefined4 uStack_162c;
  value_type local_1628;
  pointer *local_15f8;
  uint local_15f0;
  undefined4 uStack_15ec;
  pointer local_15e8 [2];
  pointer *local_15d8;
  uint local_15d0;
  undefined4 uStack_15cc;
  pointer local_15c8 [2];
  rectangle<perior::point<double,_2UL>_> local_15b8;
  pointer *local_1598;
  long local_1590;
  pointer local_1588 [2];
  void *local_1578;
  iterator iStack_1570;
  rectangle<perior::point<double,_2UL>_> *local_1568;
  double local_1560 [4];
  uniform_int_distribution<unsigned_long> local_1540;
  undefined1 local_1530 [16];
  double local_1520;
  double dStack_1518;
  double local_1510;
  double dStack_1508;
  double local_1500;
  double dStack_14f8;
  double local_14f0;
  double dStack_14e8;
  pointer local_14e0;
  stored_size_type sStack_14d8;
  stored_size_type local_14d0;
  pointer ppStack_14c8;
  stored_size_type local_14c0;
  stored_size_type sStack_14b8;
  unsigned_long *local_14b0;
  stored_size_type local_14a8;
  stored_size_type local_14a0;
  unsigned_long local_1498 [8];
  unsigned_long *local_1458;
  stored_size_type local_1450;
  stored_size_type local_1448;
  unsigned_long local_1440 [9];
  cubic_periodic_boundary<perior::point<double,_2UL>_> local_13f8;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  local_13b8._M_x[0] = 0;
  local_13b8._M_x[1] = 0;
  local_1530._0_8_ = 1000.0;
  local_1530._8_8_ = 1000.0;
  perior::cubic_periodic_boundary<perior::point<double,_2UL>_>::cubic_periodic_boundary
            (&local_13f8,(point_type *)&local_13b8,(point_type *)local_1530);
  local_1530._0_8_ = -NAN;
  local_1520 = local_13f8.lower_.values_.elems[0];
  dStack_1518 = local_13f8.lower_.values_.elems[1];
  local_1510 = local_13f8.upper_.values_.elems[0];
  dStack_1508 = local_13f8.upper_.values_.elems[1];
  local_1500 = local_13f8.width_.values_.elems[0];
  dStack_14f8 = local_13f8.width_.values_.elems[1];
  local_14f0 = local_13f8.half_width_.values_.elems[0];
  dStack_14e8 = local_13f8.half_width_.values_.elems[1];
  local_14b0 = local_1498;
  local_14e0 = (pointer)0x0;
  sStack_14d8 = 0;
  local_14d0 = 0;
  ppStack_14c8 = (pointer)0x0;
  local_14c0 = 0;
  sStack_14b8 = 0;
  local_14a8 = 0;
  local_14a0 = 8;
  local_1458 = local_1440;
  local_1450 = 0;
  local_1448 = 8;
  local_13b8._M_x[0] = 0x75bcd15;
  lVar9 = 1;
  uVar15 = 0x75bcd15;
  do {
    uVar15 = (ulong)(((uint)(uVar15 >> 0x1e) ^ (uint)uVar15) * 0x6c078965 + (int)lVar9);
    local_13b8._M_x[lVar9] = uVar15;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x270);
  local_13b8._M_p = 0x270;
  uVar15 = 0;
  local_1540._M_param._M_a = 0;
  local_1540._M_param._M_b = 10000;
  local_1568 = (rectangle<perior::point<double,_2UL>_> *)0x0;
  local_1578 = (void *)0x0;
  iStack_1570._M_current = (rectangle<perior::point<double,_2UL>_> *)0x0;
  ppVar5 = &local_1628.first.radius;
  do {
    local_15b8.radius.values_.elems[0] = 0.0;
    local_15b8.radius.values_.elems[1] = 0.0;
    local_15b8.center.values_.elems[0] = 0.0;
    local_15b8.center.values_.elems[1] = 0.0;
    rVar10 = std::uniform_int_distribution<unsigned_long>::operator()
                       (&local_1540,&local_13b8,&local_1540._M_param);
    iVar14 = (int)rVar10 + (int)(rVar10 / 100) * -100;
    local_1560[2] = (double)(iVar14 * 10);
    local_1560[3] = (double)((rVar10 / 100) * 10);
    local_1560[0] = (double)(iVar14 * 10 + 10);
    local_1560[1] = local_1560[3] + 10.0;
    local_1648[0] = (pointer *)0x0;
    local_1648[1] = (pointer *)0x0;
    lVar9 = 0;
    do {
      local_1648[lVar9] = (pointer *)(local_1560[lVar9] + local_1560[lVar9 + 2]);
      lVar9 = lVar9 + 1;
    } while (lVar9 == 1);
    local_1628.first.center.values_.elems[0] = 0.0;
    local_1628.first.center.values_.elems[1] = 0.0;
    lVar9 = 0;
    do {
      local_1628.first.center.values_.elems[lVar9] = (double)local_1648[lVar9] * 0.5;
      dVar8 = local_1628.first.center.values_.elems[1];
      dVar7 = local_1628.first.center.values_.elems[0];
      lVar9 = lVar9 + 1;
    } while (lVar9 == 1);
    local_15b8.center.values_.elems[0] = local_1628.first.center.values_.elems[0];
    local_15b8.center.values_.elems[1] = local_1628.first.center.values_.elems[1];
    local_1648[0] = (pointer *)0x0;
    local_1648[1] = (pointer *)0x0;
    lVar9 = 0;
    do {
      local_1648[lVar9] = (pointer *)(local_1560[lVar9] - local_1560[lVar9 + 2]);
      lVar9 = lVar9 + 1;
    } while (lVar9 == 1);
    local_1628.first.center.values_.elems[0] = 0.0;
    local_1628.first.center.values_.elems[1] = 0.0;
    lVar9 = 0;
    do {
      local_1628.first.center.values_.elems[lVar9] = (double)local_1648[lVar9] * 0.5;
      lVar9 = lVar9 + 1;
    } while (lVar9 == 1);
    local_15b8.radius.values_.elems[0] = local_1628.first.center.values_.elems[0];
    local_15b8.radius.values_.elems[1] = local_1628.first.center.values_.elems[1];
    if (iStack_1570._M_current == local_1568) {
      std::
      vector<perior::rectangle<perior::point<double,2ul>>,std::allocator<perior::rectangle<perior::point<double,2ul>>>>
      ::_M_realloc_insert<perior::rectangle<perior::point<double,2ul>>const&>
                ((vector<perior::rectangle<perior::point<double,2ul>>,std::allocator<perior::rectangle<perior::point<double,2ul>>>>
                  *)&local_1578,iStack_1570,&local_15b8);
    }
    else {
      ((iStack_1570._M_current)->center).values_.elems[0] = dVar7;
      ((iStack_1570._M_current)->center).values_.elems[1] = dVar8;
      ((iStack_1570._M_current)->radius).values_.elems[0] = local_1628.first.center.values_.elems[0]
      ;
      ((iStack_1570._M_current)->radius).values_.elems[1] = local_1628.first.center.values_.elems[1]
      ;
      iStack_1570._M_current = iStack_1570._M_current + 1;
    }
    local_1628.first.center.values_.elems[0] = local_15b8.center.values_.elems[0];
    local_1628.first.center.values_.elems[1] = local_15b8.center.values_.elems[1];
    local_1628.first.radius.values_.elems[0] = local_15b8.radius.values_.elems[0];
    local_1628.first.radius.values_.elems[1] = local_15b8.radius.values_.elems[1];
    local_1628.second = uVar15;
    perior::
    rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
    ::insert((rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
              *)local_1530,&local_1628);
    local_15d8 = local_15c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_15d8,"rtree_","");
    cVar20 = '\x01';
    if (9 < uVar15) {
      uVar16 = uVar15;
      cVar21 = '\x04';
      do {
        cVar20 = cVar21;
        if (uVar16 < 100) {
          cVar20 = cVar20 + -2;
          goto LAB_00105b3b;
        }
        if (uVar16 < 1000) {
          cVar20 = cVar20 + -1;
          goto LAB_00105b3b;
        }
        if (uVar16 < 10000) goto LAB_00105b3b;
        bVar6 = 99999 < uVar16;
        uVar16 = uVar16 / 10000;
        cVar21 = cVar20 + '\x04';
      } while (bVar6);
      cVar20 = cVar20 + '\x01';
    }
LAB_00105b3b:
    local_15f8 = local_15e8;
    std::__cxx11::string::_M_construct((ulong)&local_15f8,cVar20);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_15f8,local_15f0,uVar15);
    pcVar22 = (pointer)0xf;
    if (local_15d8 != local_15c8) {
      pcVar22 = local_15c8[0];
    }
    pcVar3 = (pointer)(CONCAT44(uStack_15ec,local_15f0) + CONCAT44(uStack_15cc,local_15d0));
    if (pcVar22 < pcVar3) {
      pcVar22 = (pointer)0xf;
      if (local_15f8 != local_15e8) {
        pcVar22 = local_15e8[0];
      }
      if (pcVar22 < pcVar3) goto LAB_00105bb1;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_15f8,0,(char *)0x0,(ulong)local_15d8);
    }
    else {
LAB_00105bb1:
      puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_15d8,(ulong)local_15f8)
      ;
    }
    ppcVar1 = (pointer *)(puVar11 + 2);
    if ((pointer *)*puVar11 == ppcVar1) {
      local_1638 = *ppcVar1;
      uStack_1630 = *(undefined4 *)(puVar11 + 3);
      uStack_162c = *(undefined4 *)((long)puVar11 + 0x1c);
      local_1648[0] = &local_1638;
    }
    else {
      local_1638 = *ppcVar1;
      local_1648[0] = (pointer *)*puVar11;
    }
    local_1648[1] = (pointer *)puVar11[1];
    *puVar11 = ppcVar1;
    puVar11[1] = 0;
    *(undefined1 *)ppcVar1 = 0;
    local_1598 = local_1588;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1598,".svg","");
    pcVar22 = (pointer)0xf;
    if (local_1648[0] != &local_1638) {
      pcVar22 = local_1638;
    }
    if (pcVar22 < (pointer)(local_1590 + (long)local_1648[1])) {
      pcVar22 = (pointer)0xf;
      if (local_1598 != local_1588) {
        pcVar22 = local_1588[0];
      }
      if (pcVar22 < (pointer)(local_1590 + (long)local_1648[1])) goto LAB_00105c8c;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_1598,0,(char *)0x0,(ulong)local_1648[0])
      ;
    }
    else {
LAB_00105c8c:
      puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)local_1648,(ulong)local_1598);
    }
    pdVar4 = (double *)(puVar11 + 2);
    if ((point_type *)*puVar11 == (point_type *)pdVar4) {
      local_1628.first.radius.values_.elems[0] = *pdVar4;
      local_1628.first.radius.values_.elems[1] = (double)puVar11[3];
      local_1628.first.center.values_.elems[0] = (double)ppVar5;
    }
    else {
      local_1628.first.radius.values_.elems[0] = *pdVar4;
      local_1628.first.center.values_.elems[0] = (double)*puVar11;
    }
    pbVar18 = (boundary_t *)(puVar11 + 1);
    local_1628.first.center.values_.elems[1] = (double)puVar11[1];
    *puVar11 = pdVar4;
    (pbVar18->lower_).values_.elems[0] = 0.0;
    *(undefined1 *)pdVar4 = 0;
    if (local_1598 != local_1588) {
      operator_delete(local_1598);
      pbVar18 = extraout_RDX;
    }
    if (local_1648[0] != &local_1638) {
      operator_delete(local_1648[0]);
      pbVar18 = extraout_RDX_00;
    }
    if (local_15f8 != local_15e8) {
      operator_delete(local_15f8);
      pbVar18 = extraout_RDX_01;
    }
    if (local_15d8 != local_15c8) {
      operator_delete(local_15d8);
      pbVar18 = extraout_RDX_02;
    }
    dump((string *)&local_1628,
         (rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
          *)local_1530,pbVar18);
    if ((point_type *)local_1628.first.center.values_.elems[0] != ppVar5) {
      operator_delete((void *)local_1628.first.center.values_.elems[0]);
    }
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0x32);
  uVar19 = 0x32;
  do {
    uVar15 = uVar19 - 0x32;
    *(uint *)(std::ofstream::close + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::ofstream::close + *(long *)(std::cout + -0x18)) | 1;
    if ((ulong)((long)iStack_1570._M_current - (long)local_1578 >> 5) <= uVar15) {
      uVar13 = std::__throw_out_of_range_fmt
                         (
                         "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         );
      if (local_1648[0] != (pointer *)0x0) {
        operator_delete(local_1648[0]);
      }
      if (local_1578 != (void *)0x0) {
        operator_delete(local_1578);
      }
      perior::
      rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
      ::~rtree((rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                *)local_1530);
      _Unwind_Resume(uVar13);
    }
    pdVar4 = (double *)((long)local_1578 + uVar15 * 0x20);
    local_1628.first.center.values_.elems[0] = *pdVar4;
    local_1628.first.center.values_.elems[1] = pdVar4[1];
    pdVar4 = (double *)((long)local_1578 + uVar15 * 0x20 + 0x10);
    local_1628.first.radius.values_.elems[0] = *pdVar4;
    local_1628.first.radius.values_.elems[1] = pdVar4[1];
    local_1628.second = uVar15;
    perior::
    rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
    ::remove((rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
              *)local_1530,(char *)&local_1628);
    poVar12 = std::ostream::_M_insert<bool>(false);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    local_1648[0] = &local_1638;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1648,"rtree_","");
    uVar17 = uVar19;
    cVar20 = '\x04';
    do {
      cVar21 = cVar20;
      if (uVar17 < 100) {
        cVar21 = cVar21 + -2;
        goto LAB_00105e74;
      }
      if (uVar17 < 1000) {
        cVar21 = cVar21 + -1;
        goto LAB_00105e74;
      }
      if (uVar17 < 10000) goto LAB_00105e74;
      bVar6 = 99999 < uVar17;
      uVar17 = uVar17 / 10000;
      cVar20 = cVar21 + '\x04';
    } while (bVar6);
    cVar21 = cVar21 + '\x01';
LAB_00105e74:
    local_15d8 = local_15c8;
    std::__cxx11::string::_M_construct((ulong)&local_15d8,cVar21);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_15d8,local_15d0,uVar19);
    pcVar22 = (pointer)0xf;
    if (local_1648[0] != &local_1638) {
      pcVar22 = local_1638;
    }
    pcVar3 = (pointer)(CONCAT44(uStack_15cc,local_15d0) + (long)local_1648[1]);
    if (pcVar22 < pcVar3) {
      pcVar22 = (pointer)0xf;
      if (local_15d8 != local_15c8) {
        pcVar22 = local_15c8[0];
      }
      if (pcVar22 < pcVar3) goto LAB_00105ee7;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_15d8,0,(char *)0x0,(ulong)local_1648[0])
      ;
    }
    else {
LAB_00105ee7:
      puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)local_1648,(ulong)local_15d8);
    }
    local_15b8.center.values_.elems[0] = (double)&local_15b8.radius;
    puVar2 = puVar11 + 2;
    if ((point_type *)*puVar11 == (point_type *)puVar2) {
      local_15b8.radius.values_.elems[0] = (double)*puVar2;
      local_15b8.radius.values_.elems[1] = (double)puVar11[3];
    }
    else {
      local_15b8.radius.values_.elems[0] = (double)*puVar2;
      local_15b8.center.values_.elems[0] = (double)*puVar11;
    }
    local_15b8.center.values_.elems[1] = (double)puVar11[1];
    *puVar11 = puVar2;
    puVar11[1] = 0;
    *(undefined1 *)puVar2 = 0;
    local_15f8 = local_15e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_15f8,".svg","");
    pcVar22 = (pointer)0xf;
    if ((point_type *)local_15b8.center.values_.elems[0] != &local_15b8.radius) {
      pcVar22 = (pointer)local_15b8.radius.values_.elems[0];
    }
    pcVar3 = (pointer)(CONCAT44(uStack_15ec,local_15f0) + (long)local_15b8.center.values_.elems[1]);
    if (pcVar22 < pcVar3) {
      pcVar22 = (pointer)0xf;
      if (local_15f8 != local_15e8) {
        pcVar22 = local_15e8[0];
      }
      if (pcVar22 < pcVar3) goto LAB_00105fd2;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_15f8,0,(char *)0x0,
                           (ulong)local_15b8.center.values_.elems[0]);
    }
    else {
LAB_00105fd2:
      puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_15b8,(ulong)local_15f8)
      ;
    }
    pdVar4 = (double *)(puVar11 + 2);
    if ((point_type *)*puVar11 == (point_type *)pdVar4) {
      local_1628.first.radius.values_.elems[0] = *pdVar4;
      local_1628.first.radius.values_.elems[1] = (double)puVar11[3];
      local_1628.first.center.values_.elems[0] = (double)ppVar5;
    }
    else {
      local_1628.first.radius.values_.elems[0] = *pdVar4;
      local_1628.first.center.values_.elems[0] = (double)*puVar11;
    }
    pbVar18 = (boundary_t *)(puVar11 + 1);
    local_1628.first.center.values_.elems[1] = (double)puVar11[1];
    *puVar11 = pdVar4;
    (pbVar18->lower_).values_.elems[0] = 0.0;
    *(undefined1 *)pdVar4 = 0;
    if (local_15f8 != local_15e8) {
      operator_delete(local_15f8);
      pbVar18 = extraout_RDX_03;
    }
    if ((point_type *)local_15b8.center.values_.elems[0] != &local_15b8.radius) {
      operator_delete((void *)local_15b8.center.values_.elems[0]);
      pbVar18 = extraout_RDX_04;
    }
    if (local_15d8 != local_15c8) {
      operator_delete(local_15d8);
      pbVar18 = extraout_RDX_05;
    }
    if (local_1648[0] != &local_1638) {
      operator_delete(local_1648[0]);
      pbVar18 = extraout_RDX_06;
    }
    dump((string *)&local_1628,(rtree_t *)local_1530,pbVar18);
    if ((point_type *)local_1628.first.center.values_.elems[0] != ppVar5) {
      operator_delete((void *)local_1628.first.center.values_.elems[0]);
    }
    uVar19 = uVar19 + 1;
  } while (uVar19 != 0x46);
  uVar19 = 0x46;
  do {
    local_15b8.radius.values_.elems[0] = 0.0;
    local_15b8.radius.values_.elems[1] = 0.0;
    local_15b8.center.values_.elems[0] = 0.0;
    local_15b8.center.values_.elems[1] = 0.0;
    rVar10 = std::uniform_int_distribution<unsigned_long>::operator()
                       (&local_1540,&local_13b8,&local_1540._M_param);
    iVar14 = (int)rVar10 + (int)(rVar10 / 100) * -100;
    local_1560[2] = (double)(iVar14 * 10);
    local_1560[3] = (double)((rVar10 / 100) * 10);
    local_1560[0] = (double)(iVar14 * 10 + 10);
    local_1560[1] = local_1560[3] + 10.0;
    local_1648[0] = (pointer *)0x0;
    local_1648[1] = (pointer *)0x0;
    lVar9 = 0;
    do {
      local_1648[lVar9] = (pointer *)(local_1560[lVar9] + local_1560[lVar9 + 2]);
      lVar9 = lVar9 + 1;
    } while (lVar9 == 1);
    local_1628.first.center.values_.elems[0] = 0.0;
    local_1628.first.center.values_.elems[1] = 0.0;
    lVar9 = 0;
    do {
      local_1628.first.center.values_.elems[lVar9] = (double)local_1648[lVar9] * 0.5;
      dVar8 = local_1628.first.center.values_.elems[1];
      dVar7 = local_1628.first.center.values_.elems[0];
      lVar9 = lVar9 + 1;
    } while (lVar9 == 1);
    local_15b8.center.values_.elems[0] = local_1628.first.center.values_.elems[0];
    local_15b8.center.values_.elems[1] = local_1628.first.center.values_.elems[1];
    local_1648[0] = (pointer *)0x0;
    local_1648[1] = (pointer *)0x0;
    lVar9 = 0;
    do {
      local_1648[lVar9] = (pointer *)(local_1560[lVar9] - local_1560[lVar9 + 2]);
      lVar9 = lVar9 + 1;
    } while (lVar9 == 1);
    local_1628.first.center.values_.elems[0] = 0.0;
    local_1628.first.center.values_.elems[1] = 0.0;
    lVar9 = 0;
    do {
      local_1628.first.center.values_.elems[lVar9] = (double)local_1648[lVar9] * 0.5;
      lVar9 = lVar9 + 1;
    } while (lVar9 == 1);
    local_15b8.radius.values_.elems[0] = local_1628.first.center.values_.elems[0];
    local_15b8.radius.values_.elems[1] = local_1628.first.center.values_.elems[1];
    if (iStack_1570._M_current == local_1568) {
      std::
      vector<perior::rectangle<perior::point<double,2ul>>,std::allocator<perior::rectangle<perior::point<double,2ul>>>>
      ::_M_realloc_insert<perior::rectangle<perior::point<double,2ul>>const&>
                ((vector<perior::rectangle<perior::point<double,2ul>>,std::allocator<perior::rectangle<perior::point<double,2ul>>>>
                  *)&local_1578,iStack_1570,&local_15b8);
    }
    else {
      ((iStack_1570._M_current)->center).values_.elems[0] = dVar7;
      ((iStack_1570._M_current)->center).values_.elems[1] = dVar8;
      ((iStack_1570._M_current)->radius).values_.elems[0] = local_1628.first.center.values_.elems[0]
      ;
      ((iStack_1570._M_current)->radius).values_.elems[1] = local_1628.first.center.values_.elems[1]
      ;
      iStack_1570._M_current = iStack_1570._M_current + 1;
    }
    local_1628.first.center.values_.elems[0] = local_15b8.center.values_.elems[0];
    local_1628.first.center.values_.elems[1] = local_15b8.center.values_.elems[1];
    local_1628.first.radius.values_.elems[0] = local_15b8.radius.values_.elems[0];
    local_1628.first.radius.values_.elems[1] = local_15b8.radius.values_.elems[1];
    local_1628.second = uVar19;
    perior::
    rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
    ::insert((rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
              *)local_1530,&local_1628);
    local_15d8 = local_15c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_15d8,"rtree_","");
    uVar17 = uVar19;
    cVar20 = '\x04';
    do {
      cVar21 = cVar20;
      if (uVar17 < 100) {
        cVar21 = cVar21 + -2;
        goto LAB_0010631a;
      }
      if (uVar17 < 1000) {
        cVar21 = cVar21 + -1;
        goto LAB_0010631a;
      }
      if (uVar17 < 10000) goto LAB_0010631a;
      bVar6 = 99999 < uVar17;
      uVar17 = uVar17 / 10000;
      cVar20 = cVar21 + '\x04';
    } while (bVar6);
    cVar21 = cVar21 + '\x01';
LAB_0010631a:
    local_15f8 = local_15e8;
    std::__cxx11::string::_M_construct((ulong)&local_15f8,cVar21);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_15f8,local_15f0,uVar19);
    pcVar22 = (pointer)0xf;
    if (local_15d8 != local_15c8) {
      pcVar22 = local_15c8[0];
    }
    pcVar3 = (pointer)(CONCAT44(uStack_15ec,local_15f0) + CONCAT44(uStack_15cc,local_15d0));
    if (pcVar22 < pcVar3) {
      pcVar22 = (pointer)0xf;
      if (local_15f8 != local_15e8) {
        pcVar22 = local_15e8[0];
      }
      if (pcVar22 < pcVar3) goto LAB_00106390;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_15f8,0,(char *)0x0,(ulong)local_15d8);
    }
    else {
LAB_00106390:
      puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_15d8,(ulong)local_15f8)
      ;
    }
    ppcVar1 = (pointer *)(puVar11 + 2);
    if ((pointer *)*puVar11 == ppcVar1) {
      local_1638 = *ppcVar1;
      uStack_1630 = *(undefined4 *)(puVar11 + 3);
      uStack_162c = *(undefined4 *)((long)puVar11 + 0x1c);
      local_1648[0] = &local_1638;
    }
    else {
      local_1638 = *ppcVar1;
      local_1648[0] = (pointer *)*puVar11;
    }
    local_1648[1] = (pointer *)puVar11[1];
    *puVar11 = ppcVar1;
    puVar11[1] = 0;
    *(undefined1 *)ppcVar1 = 0;
    local_1598 = local_1588;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1598,".svg","");
    pcVar22 = (pointer)0xf;
    if (local_1648[0] != &local_1638) {
      pcVar22 = local_1638;
    }
    if (pcVar22 < (pointer)(local_1590 + (long)local_1648[1])) {
      pcVar22 = (pointer)0xf;
      if (local_1598 != local_1588) {
        pcVar22 = local_1588[0];
      }
      if (pcVar22 < (pointer)(local_1590 + (long)local_1648[1])) goto LAB_0010646b;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_1598,0,(char *)0x0,(ulong)local_1648[0])
      ;
    }
    else {
LAB_0010646b:
      puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)local_1648,(ulong)local_1598);
    }
    pdVar4 = (double *)(puVar11 + 2);
    if ((point_type *)*puVar11 == (point_type *)pdVar4) {
      local_1628.first.radius.values_.elems[0] = *pdVar4;
      local_1628.first.radius.values_.elems[1] = (double)puVar11[3];
      local_1628.first.center.values_.elems[0] = (double)ppVar5;
    }
    else {
      local_1628.first.radius.values_.elems[0] = *pdVar4;
      local_1628.first.center.values_.elems[0] = (double)*puVar11;
    }
    pbVar18 = (boundary_t *)(puVar11 + 1);
    local_1628.first.center.values_.elems[1] = (double)puVar11[1];
    *puVar11 = pdVar4;
    (pbVar18->lower_).values_.elems[0] = 0.0;
    *(undefined1 *)pdVar4 = 0;
    if (local_1598 != local_1588) {
      operator_delete(local_1598);
      pbVar18 = extraout_RDX_07;
    }
    if (local_1648[0] != &local_1638) {
      operator_delete(local_1648[0]);
      pbVar18 = extraout_RDX_08;
    }
    if (local_15f8 != local_15e8) {
      operator_delete(local_15f8);
      pbVar18 = extraout_RDX_09;
    }
    if (local_15d8 != local_15c8) {
      operator_delete(local_15d8);
      pbVar18 = extraout_RDX_10;
    }
    dump((string *)&local_1628,
         (rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
          *)local_1530,pbVar18);
    if ((point_type *)local_1628.first.center.values_.elems[0] != ppVar5) {
      operator_delete((void *)local_1628.first.center.values_.elems[0]);
    }
    uVar19 = uVar19 + 1;
    if (uVar19 == 0x5a) {
      local_15b8.center.values_.elems[0] = iStack_1570._M_current[-1].center.values_.elems[0];
      local_15b8.center.values_.elems[1] = iStack_1570._M_current[-1].center.values_.elems[1];
      local_15b8.radius.values_.elems[0] = iStack_1570._M_current[-1].radius.values_.elems[0];
      local_15b8.radius.values_.elems[1] = iStack_1570._M_current[-1].radius.values_.elems[1];
      local_1648[0] = (pointer *)0x0;
      local_1648[1] = (pointer *)0x0;
      local_1638 = (pointer)0x0;
      if ((double)local_1530._0_8_ != -NAN) {
        local_1628.first.center.values_.elems[0] = local_15b8.center.values_.elems[0];
        local_1628.first.center.values_.elems[1] = local_15b8.center.values_.elems[1];
        local_1628.first.radius.values_.elems[0] = local_15b8.radius.values_.elems[0];
        local_1628.first.radius.values_.elems[1] = local_15b8.radius.values_.elems[1];
        perior::
        rtree<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,perior::quadratic<6ul,2ul>,perior::cubic_periodic_boundary<perior::point<double,2ul>>,perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::equal_to<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>
        ::
        query_impl<perior::query::query_intersects_box<perior::point<double,2ul>>,std::back_insert_iterator<std::vector<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>>>
                  ((rtree<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,perior::quadratic<6ul,2ul>,perior::cubic_periodic_boundary<perior::point<double,2ul>>,perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::equal_to<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>
                    *)local_1530,local_1530._0_8_,
                   (query_intersects_box<perior::point<double,_2UL>_> *)&local_1628,
                   (vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                    *)local_1648);
      }
      ppcVar25 = local_1648[1];
      ppcVar1 = local_1648[0];
      if (local_1648[0] != local_1648[1]) {
        lVar23 = (long)local_1648[1] - (long)local_1648[0];
        uVar15 = (lVar23 >> 3) * -0x3333333333333333;
        lVar9 = 0x3f;
        if (uVar15 != 0) {
          for (; uVar15 >> lVar9 == 0; lVar9 = lVar9 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>*,std::vector<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                  (local_1648[0],local_1648[1],((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar23 < 0x281) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>*,std::vector<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                    (ppcVar1,ppcVar25);
        }
        else {
          ppcVar24 = ppcVar1 + 0x50;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>*,std::vector<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                    (ppcVar1,ppcVar24);
          for (; ppcVar24 != ppcVar25; ppcVar24 = ppcVar24 + 5) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>*,std::vector<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>>,__gnu_cxx::__ops::_Val_comp_iter<main::__0>>
                      (ppcVar24);
          }
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"queried values = { ",0x13);
      ppcVar1 = local_1648[1];
      if (local_1648[0] != local_1648[1]) {
        ppcVar25 = local_1648[0];
        do {
          poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          local_1628.first.center.values_.elems[0] =
               (double)CONCAT71(local_1628.first.center.values_.elems[0]._1_7_,0x20);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)&local_1628,1);
          ppcVar25 = ppcVar25 + 5;
        } while (ppcVar25 != ppcVar1);
      }
      local_1628.first.center.values_.elems[0] =
           (double)CONCAT71(local_1628.first.center.values_.elems[0]._1_7_,0x7d);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)&local_1628,1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      if (local_1648[0] != (pointer *)0x0) {
        operator_delete(local_1648[0]);
      }
      if (local_1578 != (void *)0x0) {
        operator_delete(local_1578);
      }
      perior::
      rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
      ::~rtree((rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                *)local_1530);
      return 0;
    }
  } while( true );
}

Assistant:

int main()
{
    boundary_t bdry(point_t{0,0}, point_t{1000, 1000});
    rtree_t tree(bdry);

    std::mt19937 mt_(123456789);
    std::uniform_int_distribution<std::size_t> uni(0, 10000);

    std::vector<aabb_t> boxes;
    for(std::size_t i=0; i<50; ++i)
    {
        aabb_t box;
        const std::size_t spidx = uni(mt_);
        const std::size_t xidx  =  spidx % 100;
        const std::size_t yidx  = (spidx - xidx) / 100;
        const point_t l(xidx * 10, yidx * 10);
        const point_t u(l[0] + 10, l[1] + 10);

        box.center = (u + l) / 2;
        box.radius = (u - l) / 2;
        boxes.push_back(box);

        tree.insert(value_t(box, i));

        std::string fname = std::string("rtree_") + std::to_string(i) + std::string(".svg");
        dump(fname, tree, bdry);

    }

    for(std::size_t i=50; i<70; ++i)
    {
        const std::size_t idx = i - 50;
        std::cout << std::boolalpha << tree.remove(value_t(boxes.at(idx), idx)) << std::endl;
        std::string fname = std::string("rtree_") + std::to_string(i) + std::string(".svg");
        dump(fname, tree, bdry);
    }

    for(std::size_t i=70; i<90; ++i)
    {
        aabb_t box;
        const std::size_t spidx = uni(mt_);
        const std::size_t xidx  =  spidx % 100;
        const std::size_t yidx  = (spidx - xidx) / 100;
        const point_t l(xidx * 10, yidx * 10);
        const point_t u(l[0] + 10, l[1] + 10);

        box.center = (u + l) / 2;
        box.radius = (u - l) / 2;
        boxes.push_back(box);

        tree.insert(value_t(box, i));
        std::string fname = std::string("rtree_") + std::to_string(i) + std::string(".svg");
        dump(fname, tree, bdry);
    }

    aabb_t q(boxes.back());
    std::vector<value_t> vals;
    tree.query(perior::query::intersects_box(q), std::back_inserter(vals));

    std::sort(vals.begin(), vals.end(), [](const value_t& lhs, const value_t rhs){return lhs.second < rhs.second;});

    std::cout << "queried values = { ";
    for(auto const& i : vals)
        std::cout << i.second << ' ';
    std::cout << '}' << std::endl;

    return 0;
}